

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

string * cmExtraEclipseCDT4Generator::GetPathBasename(string *__return_storage_ptr__,string *path)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  long lVar4;
  long *local_38 [2];
  long local_28 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + path->_M_string_length);
  while ((sVar3 = __return_storage_ptr__->_M_string_length, sVar3 != 0 &&
         ((cVar1 = (__return_storage_ptr__->_M_dataplus)._M_p[sVar3 - 1], cVar1 == '\\' ||
          (cVar1 == '/'))))) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)sVar3 + -1);
  }
  lVar4 = std::__cxx11::string::find_last_of
                    ((char *)__return_storage_ptr__,0x5a8f3d,0xffffffffffffffff);
  if (lVar4 != -1) {
    std::__cxx11::string::substr((ulong)local_38,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmExtraEclipseCDT4Generator::GetPathBasename(const std::string& path)
{
  std::string outputBasename = path;
  while (!outputBasename.empty() &&
         (outputBasename[outputBasename.size() - 1] == '/' ||
          outputBasename[outputBasename.size() - 1] == '\\'))
    {
    outputBasename.resize(outputBasename.size() - 1);
    }
  std::string::size_type loc = outputBasename.find_last_of("/\\");
  if (loc != std::string::npos)
    {
    outputBasename = outputBasename.substr(loc + 1);
    }

  return outputBasename;
}